

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor
          (GenericSoundEssenceDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UL *pUVar3;
  MDDEntry *pMVar4;
  
  FileDescriptor::FileDescriptor(&this->super_FileDescriptor,d);
  (this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
  _vptr_KLVPacket = (_func_int **)&PTR__GenericSoundEssenceDescriptor_00217858;
  (this->AudioSamplingRate).super_Rational.Numerator = 0;
  (this->AudioSamplingRate).super_Rational.Denominator = 0;
  (this->AudioSamplingRate).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00216710;
  this->Locked = '\0';
  (this->AudioRefLevel).m_has_value = false;
  (this->ElectroSpatialFormulation).m_has_value = false;
  this->ChannelCount = 0;
  this->QuantizationBits = 0;
  (this->DialNorm).m_has_value = false;
  (this->SoundEssenceCoding).super_Identifier<16U>.m_HasValue = false;
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &this->SoundEssenceCoding;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->SoundEssenceCoding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  (this->ReferenceAudioAlignmentLevel).m_has_value = false;
  (this->ReferenceImageEditRate).m_property.super_Rational.Numerator = 0;
  (this->ReferenceImageEditRate).m_property.super_Rational.Denominator = 0;
  (this->ReferenceImageEditRate).m_property.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216710;
  (this->ReferenceImageEditRate).m_has_value = false;
  this_00 = (this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_GenericSoundEssenceDescriptor);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
    m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
     m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((long)(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
            super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x5c9,
                "ASDCP::MXF::GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor(const Dictionary *)"
               );
}

Assistant:

GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor(const Dictionary* d) : FileDescriptor(d), Locked(0), ChannelCount(0), QuantizationBits(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_GenericSoundEssenceDescriptor);
}